

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

uint64_t shuff_one_pass_freq_count
                   (uint32_t *input_u32,uint64_t input_size,uint64_t *freq,uint64_t *syms,
                   uint64_t ms)

{
  uint32_t *cup;
  uint64_t *up;
  uint64_t n;
  uint64_t ms_local;
  uint64_t *syms_local;
  uint64_t *freq_local;
  uint64_t input_size_local;
  uint32_t *input_u32_local;
  
  for (up = freq; up <= freq + ms; up = up + 1) {
    *up = 0;
  }
  n = 0;
  for (cup = input_u32; cup < input_u32 + input_size; cup = cup + 1) {
    if (freq[*cup + 1] == 0) {
      syms[n] = (ulong)(*cup + 1);
      n = n + 1;
    }
    freq[*cup + 1] = freq[*cup + 1] + 1;
  }
  *freq = 1;
  syms[n] = 0;
  return n + 1;
}

Assistant:

uint64_t shuff_one_pass_freq_count(const uint32_t* input_u32,
    uint64_t input_size, uint64_t* freq, uint64_t* syms, uint64_t ms)
{
    uint64_t n;
    uint64_t* up;
    const uint32_t* cup;

    /* clear all elements up to max_symbol = ms */
    for (up = freq; up <= freq + ms; up++)
        *up = 0;

    n = 0;
    for (cup = input_u32; cup < input_u32 + input_size; cup++) {
        if (freq[*cup + 1] == 0)
            syms[n++] = *cup + 1;
        freq[*cup + 1]++;
    }
    freq[0] = 1;
    syms[n++] = 0;

    return n;
}